

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::OpenPopupEx(ImGuiID id)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ImGuiWindow *pIVar6;
  ImVec2 IVar7;
  ImGuiPopupData *pIVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ImGuiContext *pIVar11;
  ImVec2 *pIVar12;
  ImGuiPopupData *__dest;
  int iVar13;
  int iVar14;
  ImGuiContext *ctx;
  undefined1 auVar15 [64];
  ImVec2 local_48;
  ImGuiPopupData *local_40;
  ImGuiWindow *local_38;
  undefined1 extraout_var [56];
  
  pIVar11 = GImGui;
  iVar2 = (GImGui->BeginPopupStack).Size;
  local_48.x = 0.0;
  local_48.y = 0.0;
  pIVar6 = GImGui->NavWindow;
  iVar3 = GImGui->FrameCount;
  uVar4 = (GImGui->CurrentWindow->IDStack).Data[(long)(GImGui->CurrentWindow->IDStack).Size + -1];
  auVar15._0_8_ = NavCalcPreferredRefPos();
  auVar15._8_56_ = extraout_var;
  local_48 = (ImVec2)vmovlps_avx(auVar15._0_16_);
  uVar9 = vcmpps_avx512vl(SUB6416(ZEXT464(0xc87a0000),0),ZEXT416((uint)(pIVar11->IO).MousePos.x),2);
  uVar10 = vcmpps_avx512vl(SUB6416(ZEXT464(0xc87a0000),0),ZEXT416((uint)(pIVar11->IO).MousePos.y),2)
  ;
  pIVar12 = &(pIVar11->IO).MousePos;
  if (((uint)uVar9 & (uint)uVar10 & 1) == 0) {
    pIVar12 = &local_48;
  }
  IVar7 = *pIVar12;
  iVar5 = (pIVar11->OpenPopupStack).Size;
  if (iVar2 < iVar5) {
    pIVar8 = (pIVar11->OpenPopupStack).Data;
    if ((pIVar8[iVar2].PopupId == id) && (pIVar8[iVar2].OpenFrameCount == iVar3 + -1)) {
      pIVar8[iVar2].OpenFrameCount = iVar3;
      return;
    }
    iVar13 = iVar2 + 1;
    iVar5 = (pIVar11->OpenPopupStack).Capacity;
    local_38 = pIVar6;
    if (iVar5 <= iVar2) {
      if (iVar5 == 0) {
        iVar14 = 8;
      }
      else {
        iVar14 = iVar5 / 2 + iVar5;
      }
      if (iVar14 <= iVar13) {
        iVar14 = iVar13;
      }
      if (iVar5 < iVar14) {
        if (pIVar11 != (ImGuiContext *)0x0) {
          piVar1 = &(pIVar11->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        local_40 = (ImGuiPopupData *)
                   (*GImAllocatorAllocFunc)((long)iVar14 * 0x30,GImAllocatorUserData);
        pIVar8 = (pIVar11->OpenPopupStack).Data;
        if (pIVar8 != (ImGuiPopupData *)0x0) {
          memcpy(local_40,pIVar8,(long)(pIVar11->OpenPopupStack).Size * 0x30);
          pIVar8 = (pIVar11->OpenPopupStack).Data;
          if ((pIVar8 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar8,GImAllocatorUserData);
        }
        (pIVar11->OpenPopupStack).Data = local_40;
        (pIVar11->OpenPopupStack).Capacity = iVar14;
      }
    }
    (pIVar11->OpenPopupStack).Size = iVar13;
    pIVar8 = (pIVar11->OpenPopupStack).Data;
    pIVar8[iVar2].PopupId = id;
    pIVar8[iVar2].Window = (ImGuiWindow *)0x0;
    pIVar8[iVar2].SourceWindow = local_38;
    pIVar8[iVar2].OpenFrameCount = iVar3;
    pIVar8[iVar2].OpenParentId = uVar4;
    pIVar8[iVar2].OpenPopupPos = local_48;
    pIVar8[iVar2].OpenMousePos = IVar7;
  }
  else {
    iVar2 = (pIVar11->OpenPopupStack).Capacity;
    if (iVar5 == iVar2) {
      if (iVar2 == 0) {
        iVar13 = 8;
      }
      else {
        iVar13 = iVar2 / 2 + iVar2;
      }
      iVar14 = iVar5 + 1;
      if (iVar5 + 1 < iVar13) {
        iVar14 = iVar13;
      }
      if (iVar2 < iVar14) {
        if (pIVar11 != (ImGuiContext *)0x0) {
          piVar1 = &(pIVar11->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiPopupData *)
                 (*GImAllocatorAllocFunc)((long)iVar14 * 0x30,GImAllocatorUserData);
        pIVar8 = (pIVar11->OpenPopupStack).Data;
        if (pIVar8 != (ImGuiPopupData *)0x0) {
          memcpy(__dest,pIVar8,(long)(pIVar11->OpenPopupStack).Size * 0x30);
          pIVar8 = (pIVar11->OpenPopupStack).Data;
          if ((pIVar8 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar8,GImAllocatorUserData);
        }
        (pIVar11->OpenPopupStack).Data = __dest;
        (pIVar11->OpenPopupStack).Capacity = iVar14;
      }
    }
    pIVar8 = (pIVar11->OpenPopupStack).Data;
    iVar2 = (pIVar11->OpenPopupStack).Size;
    pIVar8[iVar2].PopupId = id;
    pIVar8[iVar2].Window = (ImGuiWindow *)0x0;
    pIVar8[iVar2].SourceWindow = pIVar6;
    pIVar8[iVar2].OpenFrameCount = iVar3;
    pIVar8[iVar2].OpenParentId = uVar4;
    pIVar8[iVar2].OpenPopupPos = local_48;
    pIVar8[iVar2].OpenMousePos = IVar7;
    (pIVar11->OpenPopupStack).Size = (pIVar11->OpenPopupStack).Size + 1;
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    int current_stack_size = g.BeginPopupStack.Size;
    ImGuiPopupData popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.SourceWindow = g.NavWindow;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    //IMGUI_DEBUG_LOG("OpenPopupEx(0x%08X)\n", g.FrameCount, id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            g.OpenPopupStack.resize(current_stack_size + 1);
            g.OpenPopupStack[current_stack_size] = popup_ref;
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}